

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::InstructionFolder::FoldVectors
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          InstructionFolder *this,Op opcode,uint32_t num_dims,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *operands)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  const_reference ppCVar3;
  undefined4 extraout_var_01;
  size_type sVar4;
  const_reference __x;
  long lVar5;
  uint32_t local_8c;
  value_type local_88 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *scalar_words;
  ScalarConstant *scalar_component;
  VectorConstant *vector_operand;
  Constant **operand;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *__range3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operand_values_for_one_dimension;
  uint32_t d;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *operands_local;
  uint32_t num_dims_local;
  Op opcode_local;
  InstructionFolder *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result;
  
  bVar1 = IsFoldableOpcode(this,opcode);
  if (!bVar1) {
    __assert_fail("IsFoldableOpcode(opcode) && \"Unhandled instruction opcode in FoldVectors\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                  ,0x1e0,
                  "std::vector<uint32_t> spvtools::opt::InstructionFolder::FoldVectors(spv::Op, uint32_t, const std::vector<const analysis::Constant *> &) const"
                 );
  }
  operand_values_for_one_dimension.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  operand_values_for_one_dimension.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  do {
    if (num_dims <=
        (uint)operand_values_for_one_dimension.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
      return __return_storage_ptr__;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3);
    __end3 = std::
             vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
             ::begin(operands);
    operand = (Constant **)
              std::
              vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              ::end(operands);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                                       *)&operand), bVar1) {
      vector_operand =
           (VectorConstant *)
           __gnu_cxx::
           __normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
           ::operator*(&__end3);
      iVar2 = (*((Constant *)(vector_operand->super_CompositeConstant).super_Constant._vptr_Constant
                )->_vptr_Constant[0x13])();
      scalar_component = (ScalarConstant *)CONCAT44(extraout_var,iVar2);
      if (scalar_component == (ScalarConstant *)0x0) {
        lVar5 = (**(code **)(*(vector_operand->super_CompositeConstant).super_Constant.
                              _vptr_Constant + 0xb0))();
        if (lVar5 == 0) {
          __assert_fail("false && \"FoldVectors() only accepts VectorConst or NullConst type of \" \"constant\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                        ,0x201,
                        "std::vector<uint32_t> spvtools::opt::InstructionFolder::FoldVectors(spv::Op, uint32_t, const std::vector<const analysis::Constant *> &) const"
                       );
        }
        local_88[0] = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3,local_88);
      }
      else {
        iVar2 = (*(scalar_component->super_Constant)._vptr_Constant[0x18])();
        ppCVar3 = std::
                  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  ::at((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                        *)CONCAT44(extraout_var_00,iVar2),
                       (ulong)(uint)operand_values_for_one_dimension.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar2 = (*(*ppCVar3)->_vptr_Constant[0xd])();
        scalar_words = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       CONCAT44(extraout_var_01,iVar2);
        if (scalar_words == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          lVar5 = (**(code **)(*(vector_operand->super_CompositeConstant).super_Constant.
                                _vptr_Constant + 0xb0))();
          if (lVar5 == 0) {
            __assert_fail("false && \"VectorConst should only has ScalarConst or NullConst as \" \"components\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                          ,0x1fa,
                          "std::vector<uint32_t> spvtools::opt::InstructionFolder::FoldVectors(spv::Op, uint32_t, const std::vector<const analysis::Constant *> &) const"
                         );
          }
          local_88[1] = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3,local_88 + 1);
        }
        else {
          local_80 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     (**(code **)((scalar_words->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_start + 0x30))();
          sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_80);
          if (sVar4 != 1) {
            __assert_fail("scalar_words.size() == 1 && \"Vector components with longer than 32-bit width are not allowed \" \"in FoldVectors()\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                          ,499,
                          "std::vector<uint32_t> spvtools::opt::InstructionFolder::FoldVectors(spv::Op, uint32_t, const std::vector<const analysis::Constant *> &) const"
                         );
          }
          __x = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(local_80);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3,__x);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
      ::operator++(&__end3);
    }
    local_8c = OperateWords(this,opcode,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,&local_8c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3);
    operand_values_for_one_dimension.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (uint)operand_values_for_one_dimension.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 1;
  } while( true );
}

Assistant:

std::vector<uint32_t> InstructionFolder::FoldVectors(
    spv::Op opcode, uint32_t num_dims,
    const std::vector<const analysis::Constant*>& operands) const {
  assert(IsFoldableOpcode(opcode) &&
         "Unhandled instruction opcode in FoldVectors");
  std::vector<uint32_t> result;
  for (uint32_t d = 0; d < num_dims; d++) {
    std::vector<uint32_t> operand_values_for_one_dimension;
    for (const auto& operand : operands) {
      if (const analysis::VectorConstant* vector_operand =
              operand->AsVectorConstant()) {
        // Extract the raw value of the scalar component constants
        // in 32-bit words here. The reason of not using FoldScalars() here
        // is that we do not create temporary null constants as components
        // when the vector operand is a NullConstant because Constant creation
        // may need extra checks for the validity and that is not managed in
        // here.
        if (const analysis::ScalarConstant* scalar_component =
                vector_operand->GetComponents().at(d)->AsScalarConstant()) {
          const auto& scalar_words = scalar_component->words();
          assert(
              scalar_words.size() == 1 &&
              "Vector components with longer than 32-bit width are not allowed "
              "in FoldVectors()");
          operand_values_for_one_dimension.push_back(scalar_words.front());
        } else if (operand->AsNullConstant()) {
          operand_values_for_one_dimension.push_back(0u);
        } else {
          assert(false &&
                 "VectorConst should only has ScalarConst or NullConst as "
                 "components");
        }
      } else if (operand->AsNullConstant()) {
        operand_values_for_one_dimension.push_back(0u);
      } else {
        assert(false &&
               "FoldVectors() only accepts VectorConst or NullConst type of "
               "constant");
      }
    }
    result.push_back(OperateWords(opcode, operand_values_for_one_dimension));
  }
  return result;
}